

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O2

ssize_t kiste::write(int __fd,void *__buf,size_t __n)

{
  line_t *plVar1;
  ssize_t extraout_RAX;
  line_t *line;
  line_t *line_00;
  undefined4 in_register_0000003c;
  size_t line_no;
  LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> lineTemplate;
  ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> classTemplate;
  cpp serializer;
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> kissTemplate;
  class_t class_data;
  
  lineTemplate.data = (_data_t *)CONCAT44(in_register_0000003c,__fd);
  serializer._os = (lineTemplate.data)->_os;
  lineTemplate._serialize = &serializer;
  kissTemplate.child = (terminal_t *)&terminal;
  classTemplate.child = (terminal_t *)&terminal;
  lineTemplate.child = (terminal_t *)&terminal;
  class_data._name._M_dataplus._M_p = (pointer)&class_data._name.field_2;
  class_data._name._M_string_length = 0;
  class_data._name.field_2._M_local_buf[0] = '\0';
  class_data._parent_name._M_dataplus._M_p = (pointer)&class_data._parent_name.field_2;
  class_data._parent_name._M_string_length = 0;
  class_data._parent_name.field_2._M_local_buf[0] = '\0';
  classTemplate.data = lineTemplate.data;
  classTemplate._serialize = lineTemplate._serialize;
  kissTemplate.data = lineTemplate.data;
  kissTemplate._serialize = lineTemplate._serialize;
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_header(&kissTemplate)
  ;
  plVar1 = *(line_t **)((long)__buf + 8);
  line_no = 1;
  for (line_00 = *__buf; line_00 != plVar1; line_00 = line_00 + 1) {
    switch((line_00->super_line_data_t)._type) {
    case none:
      LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_none
                (&lineTemplate);
      break;
    case cpp:
      LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_cpp<kiste::line_t>
                (&lineTemplate,line_00);
      break;
    case text:
      LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
      render_text<kiste::line_t>(&lineTemplate,line_00);
      break;
    case class_begin:
      class_t::operator=(&class_data,&(line_00->super_line_data_t)._class_data);
      ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
      render_header<kiste::class_t>(&classTemplate,line_no,&class_data);
      break;
    case class_end:
      ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
      render_footer<kiste::class_t>(&classTemplate,line_no,&class_data);
      break;
    case member:
      ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp>::
      render_member<kiste::class_t,kiste::member_t>
                ((ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp> *)
                 &classTemplate,line_no,&class_data,&(line_00->super_line_data_t)._member);
    }
    line_no = line_no + 1;
  }
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_footer(&kissTemplate)
  ;
  class_t::~class_t(&class_data);
  return extraout_RAX;
}

Assistant:

auto write(const parse_context& ctx, const std::vector<line_t>& lines) -> void
  {
    auto serializer = ::kiste::cpp(ctx._os);
    auto kissTemplate = ::kiste::KisteTemplate(ctx, serializer);
    auto classTemplate = ::kiste::ClassTemplate(ctx, serializer);
    auto lineTemplate = ::kiste::LineTemplate(ctx, serializer);

    auto class_data = class_t{};

    kissTemplate.render_header();
    auto line_no = std::size_t{0};
    for (const auto& line : lines)
    {
      ++line_no;
      switch (line._type)
      {
      case line_type::none:
        lineTemplate.render_none();
        break;
      case line_type::cpp:
        lineTemplate.render_cpp(line);
        break;
      case line_type::text:
        lineTemplate.render_text(line);
        break;
      case line_type::class_begin:
        class_data = line._class_data;
        classTemplate.render_header(line_no, class_data);
        break;
      case line_type::member:
        classTemplate.render_member(line_no, class_data, line._member);
        break;
      case line_type::class_end:
        classTemplate.render_footer(line_no, class_data);
        break;
      }
    }
    kissTemplate.render_footer();
  }